

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

bytecode_t * __thiscall tchecker::ta::system_t::statement_bytecode(system_t *this,edge_id_t id)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  edge_id_t id_local;
  system_t *this_local;
  
  bVar1 = tchecker::system::edges_t::is_edge
                    (&(this->super_system_t).super_system_t.super_edges_t,id);
  if (!bVar1) {
    __assert_fail("is_edge(id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                  ,0x5d,
                  "const tchecker::bytecode_t *tchecker::ta::system_t::statement_bytecode(tchecker::edge_id_t) const"
                 );
  }
  pvVar2 = std::
           vector<tchecker::ta::system_t::compiled_statement_t,_std::allocator<tchecker::ta::system_t::compiled_statement_t>_>
           ::operator[](&this->_statements,(ulong)id);
  peVar3 = std::__shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(pvVar2->_compiled_stmt).super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>
                     );
  return peVar3;
}

Assistant:

tchecker::bytecode_t const * system_t::statement_bytecode(tchecker::edge_id_t id) const
{
  assert(is_edge(id));
  return _statements[id]._compiled_stmt.get();
}